

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstdrex.cpp
# Opt level: O3

SQChar * sqstd_rex_matchnode(SQRex *exp,SQRexNode *node,SQChar *str,SQRexNode *next)

{
  ulong uVar1;
  char c;
  long lVar2;
  SQRexMatch *pSVar3;
  int iVar4;
  int iVar5;
  SQBool SVar6;
  SQRexNode *pSVar7;
  SQChar *pSVar8;
  SQChar *pSVar9;
  SQChar *pSVar10;
  ulong uVar11;
  SQRexNode *pSVar12;
  char *pcVar13;
  ulong uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  bool bVar21;
  
  iVar4 = node->type;
  switch(iVar4) {
  case 0x100:
    uVar16 = node->right & 0xffff;
    uVar11 = (ulong)node->right >> 0x10 & 0xffff;
    pSVar7 = next;
    if (node->next != -1) {
      pSVar7 = exp->_nodes + node->next;
    }
    uVar14 = 1;
    uVar17 = 0;
    do {
      uVar1 = uVar14 - 1;
      pSVar10 = str;
      uVar18 = uVar1;
      if ((uVar16 <= uVar1 && uVar14 != 0x10000) ||
         (pSVar9 = sqstd_rex_matchnode(exp,exp->_nodes + node->left,str,pSVar7), uVar18 = uVar17,
         pSVar9 == (SQChar *)0x0)) break;
      pSVar10 = pSVar9;
      if ((pSVar7 != (SQRexNode *)0x0) &&
         ((pSVar7->type != 0x100 || (*(short *)((long)&pSVar7->right + 2) != 0)))) {
        lVar15 = pSVar7->next;
        if ((lVar15 == -1) && ((next == (SQRexNode *)0x0 || (lVar15 = next->next, lVar15 == -1)))) {
          pSVar12 = (SQRexNode *)0x0;
        }
        else {
          pSVar12 = exp->_nodes + lVar15;
        }
        pSVar8 = sqstd_rex_matchnode(exp,pSVar7,pSVar9,pSVar12);
        if (pSVar8 != (SQChar *)0x0) {
          uVar18 = uVar11;
          if (uVar11 == uVar14 && uVar11 == uVar16) break;
          if ((uVar11 <= uVar14) && (uVar18 = uVar14, uVar16 == 0xffff || uVar1 < uVar16)) break;
        }
      }
      uVar14 = uVar14 + 1;
      uVar18 = uVar17 + 1;
      str = pSVar9;
      uVar17 = uVar18;
    } while (pSVar9 < exp->_eol);
    if ((uVar11 != uVar18 || uVar11 != uVar16) && ((long)uVar18 < (long)uVar11 || uVar16 != 0xffff))
    {
      if ((long)uVar16 < (long)uVar18) {
        pSVar10 = (SQChar *)0x0;
      }
      if ((long)uVar18 < (long)uVar11) {
        pSVar10 = (SQChar *)0x0;
      }
    }
    break;
  case 0x101:
    pSVar7 = exp->_nodes + node->left;
    for (pSVar10 = sqstd_rex_matchnode(exp,pSVar7,str,(SQRexNode *)0x0); pSVar10 != (SQChar *)0x0;
        pSVar10 = sqstd_rex_matchnode(exp,pSVar7,pSVar10,(SQRexNode *)0x0)) {
      if (pSVar7->next == -1) {
        return pSVar10;
      }
      pSVar7 = exp->_nodes + pSVar7->next;
    }
    pSVar7 = exp->_nodes + node->right;
    pSVar9 = sqstd_rex_matchnode(exp,pSVar7,str,(SQRexNode *)0x0);
    pSVar10 = (SQChar *)0x0;
    if (pSVar9 != (SQChar *)0x0) {
      do {
        if (pSVar7->next == -1) {
          return pSVar9;
        }
        pSVar7 = exp->_nodes + pSVar7->next;
        pSVar9 = sqstd_rex_matchnode(exp,pSVar7,pSVar9,(SQRexNode *)0x0);
        pSVar10 = (SQChar *)0x0;
      } while (pSVar9 != (SQChar *)0x0);
    }
    break;
  case 0x102:
  case 0x103:
    pSVar7 = exp->_nodes;
    lVar15 = node->left;
    if (iVar4 == 0x103) {
      lVar19 = exp->_currsubexp;
      lVar20 = -1;
    }
    else {
      lVar2 = node->right;
      lVar19 = exp->_currsubexp;
      lVar20 = -1;
      if (lVar2 == lVar19) {
        exp->_matches[lVar2].begin = str;
        lVar19 = lVar2 + 1;
        exp->_currsubexp = lVar19;
        lVar20 = lVar2;
      }
    }
    pSVar12 = pSVar7 + lVar15;
    do {
      pSVar7 = pSVar7 + pSVar12->next;
      if (pSVar12->next == -1) {
        pSVar7 = next;
      }
      str = sqstd_rex_matchnode(exp,pSVar12,str,pSVar7);
      if (str == (SQChar *)0x0) {
        if (lVar20 != -1) {
          pSVar3 = exp->_matches;
          pSVar3[lVar20].begin = (SQChar *)0x0;
          pSVar3[lVar20].len = 0;
        }
        goto LAB_00171f05;
      }
      if (pSVar12->next == -1) break;
      pSVar7 = exp->_nodes;
      pSVar12 = pSVar7 + pSVar12->next;
    } while (pSVar7 != (SQRexNode *)0x0);
    exp->_currsubexp = lVar19;
    pSVar10 = str;
    if (lVar20 != -1) {
      exp->_matches[lVar20].len = (long)str - (long)exp->_matches[lVar20].begin;
    }
    break;
  case 0x104:
    pSVar10 = (SQChar *)0x0;
    if (exp->_eol != str) {
      pSVar10 = str + 1;
    }
    break;
  case 0x105:
  case 0x107:
    if (exp->_eol != str) {
      pSVar7 = exp->_nodes;
      lVar15 = node->left;
      c = *str;
      do {
        iVar5 = pSVar7[lVar15].type;
        if (iVar5 == 0x106) {
          SVar6 = sqstd_rex_matchcclass(pSVar7[lVar15].left,c);
          if (SVar6 != 0) goto LAB_00171f0a;
        }
        else if (iVar5 == 0x108) {
          if ((pSVar7[lVar15].left <= (long)c) && ((long)c <= pSVar7[lVar15].right)) {
LAB_00171f0a:
            iVar5 = 0x105;
            goto LAB_00171f0f;
          }
        }
        else if (iVar5 == c) goto LAB_00171f0a;
        iVar5 = 0x107;
        if ((pSVar7 == (SQRexNode *)0x0) || (lVar15 = pSVar7[lVar15].next, lVar15 == -1))
        goto LAB_00171f0f;
      } while( true );
    }
    goto LAB_00171f05;
  case 0x106:
    if (exp->_eol != str) {
      pSVar10 = (SQChar *)sqstd_rex_matchcclass(node->left,*str);
      str = str + 1;
      bVar21 = pSVar10 == (SQChar *)0x0;
LAB_00171f25:
      if (!bVar21) {
        return str;
      }
      return pSVar10;
    }
    goto LAB_00171f05;
  default:
    if (exp->_eol != str) {
      iVar5 = (int)*str;
LAB_00171f0f:
      str = str + 1;
      bVar21 = iVar4 == iVar5;
      goto LAB_00171f18;
    }
    goto LAB_00171f05;
  case 0x10a:
    bVar21 = exp->_eol == str;
    goto LAB_00171f18;
  case 0x10b:
    bVar21 = exp->_bol == str;
    goto LAB_00171f18;
  case 0x10c:
    if (((exp->_bol != str) || (iVar4 = isspace((int)*str), iVar4 != 0)) &&
       ((exp->_eol != str || (iVar4 = isspace((int)str[-1]), iVar4 != 0)))) {
      iVar4 = isspace((int)*str);
      iVar5 = isspace((int)str[1]);
      if ((iVar4 == 0) == (iVar5 == 0)) {
        pSVar10 = (SQChar *)0x0;
        bVar21 = node->left == 0x62;
        goto LAB_00171f25;
      }
    }
    bVar21 = node->left == 0x62;
LAB_00171f18:
    pSVar10 = (SQChar *)0x0;
    if (bVar21) {
      pSVar10 = str;
    }
    break;
  case 0x10d:
    if (node->left == (long)*str) {
      pcVar13 = str + 1;
      if (pcVar13 < exp->_eol) {
        lVar15 = 1;
        do {
          if (node->right == (long)*pcVar13) {
            lVar15 = lVar15 + -1;
            if (lVar15 == 0) {
              return pcVar13 + 1;
            }
          }
          else {
            lVar15 = lVar15 + (ulong)(node->left == (long)*pcVar13);
          }
          pcVar13 = pcVar13 + 1;
        } while (pcVar13 != exp->_eol);
        return (SQChar *)0x0;
      }
    }
LAB_00171f05:
    pSVar10 = (SQChar *)0x0;
  }
  return pSVar10;
}

Assistant:

static const SQChar *sqstd_rex_matchnode(SQRex* exp,SQRexNode *node,const SQChar *str,SQRexNode *next)
{

    SQRexNodeType type = node->type;
    switch(type) {
    case OP_GREEDY: {
        //SQRexNode *greedystop = (node->next != -1) ? &exp->_nodes[node->next] : NULL;
        SQRexNode *greedystop = NULL;
        SQInteger p0 = (node->right >> 16)&0x0000FFFF, p1 = node->right&0x0000FFFF, nmaches = 0;
        const SQChar *s=str, *good = str;

        if(node->next != -1) {
            greedystop = &exp->_nodes[node->next];
        }
        else {
            greedystop = next;
        }

        while((nmaches == 0xFFFF || nmaches < p1)) {

            const SQChar *stop;
            if(!(s = sqstd_rex_matchnode(exp,&exp->_nodes[node->left],s,greedystop)))
                break;
            nmaches++;
            good=s;
            if(greedystop) {
                //checks that 0 matches satisfy the expression(if so skips)
                //if not would always stop(for instance if is a '?')
                if(greedystop->type != OP_GREEDY ||
                (greedystop->type == OP_GREEDY && ((greedystop->right >> 16)&0x0000FFFF) != 0))
                {
                    SQRexNode *gnext = NULL;
                    if(greedystop->next != -1) {
                        gnext = &exp->_nodes[greedystop->next];
                    }else if(next && next->next != -1){
                        gnext = &exp->_nodes[next->next];
                    }
                    stop = sqstd_rex_matchnode(exp,greedystop,s,gnext);
                    if(stop) {
                        //if satisfied stop it
                        if(p0 == p1 && p0 == nmaches) break;
                        else if(nmaches >= p0 && p1 == 0xFFFF) break;
                        else if(nmaches >= p0 && nmaches <= p1) break;
                    }
                }
            }

            if(s >= exp->_eol)
                break;
        }
        if(p0 == p1 && p0 == nmaches) return good;
        else if(nmaches >= p0 && p1 == 0xFFFF) return good;
        else if(nmaches >= p0 && nmaches <= p1) return good;
        return NULL;
    }
    case OP_OR: {
            const SQChar *asd = str;
            SQRexNode *temp=&exp->_nodes[node->left];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            asd = str;
            temp = &exp->_nodes[node->right];
            while( (asd = sqstd_rex_matchnode(exp,temp,asd,NULL)) ) {
                if(temp->next != -1)
                    temp = &exp->_nodes[temp->next];
                else
                    return asd;
            }
            return NULL;
    }
    case OP_EXPR:
    case OP_NOCAPEXPR:{
            SQRexNode *n = &exp->_nodes[node->left];
            const SQChar *cur = str;
            SQInteger capture = -1;
            if(node->type != OP_NOCAPEXPR && node->right == exp->_currsubexp) {
                capture = exp->_currsubexp;
                exp->_matches[capture].begin = cur;
                exp->_currsubexp++;
            }
            SQInteger tempcap = exp->_currsubexp;
            do {
                SQRexNode *subnext = NULL;
                if(n->next != -1) {
                    subnext = &exp->_nodes[n->next];
                }else {
                    subnext = next;
                }
                if(!(cur = sqstd_rex_matchnode(exp,n,cur,subnext))) {
                    if(capture != -1){
                        exp->_matches[capture].begin = 0;
                        exp->_matches[capture].len = 0;
                    }
                    return NULL;
                }
            } while((n->next != -1) && (n = &exp->_nodes[n->next]));

            exp->_currsubexp = tempcap;
            if(capture != -1)
                exp->_matches[capture].len = cur - exp->_matches[capture].begin;
            return cur;
    }
    case OP_WB:
        if((str == exp->_bol && !isspace(*str))
         || (str == exp->_eol && !isspace(*(str-1)))
         || (!isspace(*str) && isspace(*(str+1)))
         || (isspace(*str) && !isspace(*(str+1))) ) {
            return (node->left == 'b')?str:NULL;
        }
        return (node->left == 'b')?NULL:str;
    case OP_BOL:
        if(str == exp->_bol) return str;
        return NULL;
    case OP_EOL:
        if(str == exp->_eol) return str;
        return NULL;
    case OP_DOT:{
        if (str == exp->_eol) return NULL;
        str++;
                }
        return str;
    case OP_NCLASS:
    case OP_CLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchclass(exp,&exp->_nodes[node->left],*str)?(type == OP_CLASS?SQTrue:SQFalse):(type == OP_NCLASS?SQTrue:SQFalse)) {
            str++;
            return str;
        }
        return NULL;
    case OP_CCLASS:
        if (str == exp->_eol) return NULL;
        if(sqstd_rex_matchcclass(node->left,*str)) {
            str++;
            return str;
        }
        return NULL;
    case OP_MB:
        {
            SQInteger cb = node->left; //char that opens a balanced expression
            if(*str != cb) return NULL; // string doesnt start with open char
            SQInteger ce = node->right; //char that closes a balanced expression
            SQInteger cont = 1;
            const SQChar *streol = exp->_eol;
            while (++str < streol) {
              if (*str == ce) {
                if (--cont == 0) {
                    return ++str;
                }
              }
              else if (*str == cb) cont++;
            }
        }
        return NULL; // string ends out of balance
    default: /* char */
        if (str == exp->_eol) return NULL;
        if(*str != node->type) return NULL;
        str++;
        return str;
    }
    return NULL;
}